

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackComponentGroup.h
# Opt level: O2

void __thiscall cmCPackComponentGroup::~cmCPackComponentGroup(cmCPackComponentGroup *this)

{
  std::_Vector_base<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>::
  ~_Vector_base(&(this->Subgroups).
                 super__Vector_base<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>
               );
  std::_Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::~_Vector_base
            (&(this->Components).
              super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>);
  std::__cxx11::string::~string((string *)&this->Description);
  std::__cxx11::string::~string((string *)&this->DisplayName);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmCPackComponentGroup()
    : IsBold(false)
    , IsExpandedByDefault(false)
  {
  }